

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite_vfs.cpp
# Opt level: O3

int anon_unknown.dwarf_43935::xAccess(sqlite3_vfs *param_1,char *zName,int flags,int *pResOut)

{
  char *pcVar1;
  byte bVar2;
  storage_type_conflict *psVar3;
  storage_type_conflict *psVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *pResOut = 0;
  if ((flags & 0xfffffffdU) == 0) {
    if (zName == (char *)0x0) {
      psVar4 = (storage_type_conflict *)0x0;
    }
    else {
      psVar3 = (storage_type_conflict *)0xffffffffffffffff;
      do {
        psVar4 = psVar3 + 1;
        pcVar1 = zName + 1 + (long)psVar3;
        psVar3 = psVar4;
      } while (*pcVar1 != '\0');
    }
    QVar5.m_data = psVar4;
    QVar5.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar5);
    bVar2 = QFile::exists(&local_30);
    *pResOut = (uint)bVar2;
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

int xAccess(sqlite3_vfs */*svfs*/, const char *zName, int flags, int *pResOut)
{
    *pResOut = 0;
    switch (flags) {
    case SQLITE_ACCESS_EXISTS:
    case SQLITE_ACCESS_READ:
        *pResOut = QFile::exists(QString::fromUtf8(zName));
        break;
    default:
        break;
    }
    return SQLITE_OK;
}